

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscreteParameters.cpp
# Opt level: O2

void __thiscall
PlanningUnitMADPDiscreteParameters::SanityCheck(PlanningUnitMADPDiscreteParameters *this)

{
  E *this_00;
  
  if ((this->_m_JointBeliefs == true) && (this->_m_jointActionObservationHistories == false)) {
    Print(this);
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,
         "PlanningUnitMADPDiscreteParameters::SanityCheck error, in order to compute joint beliefs all joint action observation histories also need to be generated"
        );
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
  return;
}

Assistant:

void PlanningUnitMADPDiscreteParameters::SanityCheck() const
{
    if(GetComputeJointBeliefs() && !GetComputeJointActionObservationHistories())
    {
        Print();
        throw(E("PlanningUnitMADPDiscreteParameters::SanityCheck error, in order to compute joint beliefs all joint action observation histories also need to be generated"));
    }
}